

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::TestAllTypesLite_RepeatedGroup::_InternalSerialize
          (TestAllTypesLite_RepeatedGroup *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint size;
  void *data;
  bool bVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  
  if ((undefined1  [12])((undefined1  [12])this->field_0 & (undefined1  [12])0x1) !=
      (undefined1  [12])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar4 = (ulong)(this->field_0)._impl_.a_;
    pbVar2 = target + 2;
    target[0] = 0xf8;
    target[1] = '\x02';
    uVar5 = uVar4;
    if (0x7f < uVar4) {
      do {
        *pbVar2 = (byte)uVar5 | 0x80;
        uVar4 = uVar5 >> 7;
        pbVar2 = pbVar2 + 1;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar4;
      } while (bVar1);
    }
    *pbVar2 = (byte)uVar4;
    target = pbVar2 + 1;
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    data = *(void **)((uVar5 & 0xfffffffffffffffe) + 8);
    uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar5 & 1) == 0) {
      puVar6 = &google::protobuf::internal::fixed_address_empty_string;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar6 = (undefined8 *)((uVar5 & 0xfffffffffffffffe) + 8);
    }
    size = *(uint *)(puVar6 + 1);
    if ((long)stream->end_ - (long)target < (long)(int)size) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar3;
    }
    memcpy(target,data,(ulong)size);
    target = target + (int)size;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestAllTypesLite_RepeatedGroup::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestAllTypesLite_RepeatedGroup& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestAllTypesLite.RepeatedGroup)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 a = 47;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        47, this_._internal_a(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestAllTypesLite.RepeatedGroup)
  return target;
}